

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O2

void __thiscall
CreateCharacterState::processInput
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  mapped_type *pmVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  string username;
  Account account;
  int local_ec;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_98;
  string local_88;
  Account local_68;
  
  Connection::GetUsername_abi_cxx11_
            (&local_88,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  Connection::GetAccount
            (&local_68,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_ec = Connection::GetID((connection->
                               super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_state_map,&local_ec);
  switch(*pmVar1) {
  case 0:
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    processSelectCharacter(this,input,(shared_ptr<Connection> *)&local_98);
    this_00 = &local_98._M_refcount;
    break;
  case 1:
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    processChooseRace(this,input,(shared_ptr<Connection> *)&local_a8);
    this_00 = &local_a8._M_refcount;
    break;
  case 2:
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    processChooseClass(this,input,(shared_ptr<Connection> *)&local_b8);
    this_00 = &local_b8._M_refcount;
    break;
  case 3:
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c8,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    processRollStats(this,input,(shared_ptr<Connection> *)&local_c8);
    this_00 = &local_c8._M_refcount;
    break;
  case 4:
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    processNameCharacter(this,input,(shared_ptr<Connection> *)&local_d8);
    this_00 = &local_d8._M_refcount;
    break;
  case 5:
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e8,&connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
    processConfirmCharacter(this,input,(shared_ptr<Connection> *)&local_e8);
    this_00 = &local_e8._M_refcount;
    break;
  default:
    goto switchD_001676e6_default;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
switchD_001676e6_default:
  Account::~Account(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void CreateCharacterState::processInput(const std::string& input, std::shared_ptr<Connection> connection) {
    std::string username = connection->GetUsername();
    Account account = connection->GetAccount();
    int state = m_state_map[connection->GetID()];
    switch(state)
    {
        case SELECT_CHARACTER:
            processSelectCharacter(input, connection);
            break;
        case CHOOSE_RACE:
            processChooseRace(input, connection);
            break;
        case CHOOSE_CLASS:
            processChooseClass(input, connection);
            break;
        case ROLL_STATS:
            processRollStats(input, connection);
            break;
        case NAME_CHARACTER:
            processNameCharacter(input, connection);
            break;
        case CONFIRM_CHARACTER:
            processConfirmCharacter(input, connection);
            break;
        default:
            break;
    }
}